

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManEquivFixOutputPairs(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  int iVar9;
  
  if ((p->vCos->nSize - p->nRegs & 1U) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x339,"void Gia_ManEquivFixOutputPairs(Gia_Man_t *)");
  }
  pVVar7 = p->vCos;
  iVar9 = pVVar7->nSize;
  iVar8 = iVar9 - p->nRegs;
  if (iVar8 != 0 && p->nRegs <= iVar9) {
    lVar6 = 0;
    do {
      if (iVar9 <= lVar6) {
LAB_001fe3a0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = pVVar7->pArray[lVar6];
      if (((long)(int)uVar1 < 0) || (iVar2 = p->nObjs, iVar2 <= (int)uVar1)) {
LAB_001fe381:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        return;
      }
      if ((long)iVar8 <= lVar6 + 1) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if ((long)iVar9 <= lVar6 + 1) goto LAB_001fe3a0;
      iVar9 = pVVar7->pArray[lVar6 + 1];
      if (((long)iVar9 < 0) || (iVar2 <= iVar9)) goto LAB_001fe381;
      pGVar5 = pGVar3 + (int)uVar1;
      pGVar3 = pGVar3 + iVar9;
      uVar4 = *(ulong *)pGVar5;
      if (((ulong)((uint)(uVar4 >> 0x1d) & 1) ^ (ulong)(pGVar5 + -(uVar4 & 0x1fffffff))) ==
          ((ulong)((uint)(*(ulong *)pGVar3 >> 0x1d) & 1) ^
          (ulong)(pGVar3 + -(*(ulong *)pGVar3 & 0x1fffffff)))) {
        if (iVar2 <= (int)uVar1) {
LAB_001fe3bf:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        *(ulong *)pGVar5 = uVar4 & 0xffffffffc0000000 | (ulong)(uVar1 & 0x1fffffff);
        pGVar5 = p->pObjs;
        if ((pGVar3 < pGVar5) || (pGVar5 + p->nObjs <= pGVar3)) goto LAB_001fe3bf;
        *(ulong *)pGVar3 =
             *(ulong *)pGVar3 & 0xffffffffc0000000 |
             (ulong)(((uint)((int)pGVar3 - (int)pGVar5) >> 2) * -0x55555555 & 0x1fffffff);
      }
      pVVar7 = p->vCos;
      iVar9 = pVVar7->nSize;
      iVar8 = iVar9 - p->nRegs;
      lVar6 = lVar6 + 2;
    } while ((int)lVar6 < iVar8);
  }
  return;
}

Assistant:

void Gia_ManEquivFixOutputPairs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj0, * pObj1;
    int i;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    Gia_ManForEachPo( p, pObj0, i )
    {
        pObj1 = Gia_ManPo( p, ++i );
        if ( Gia_ObjChild0(pObj0) != Gia_ObjChild0(pObj1) )
            continue;
        pObj0->iDiff0  = Gia_ObjId(p, pObj0);
        pObj0->fCompl0 = 0;
        pObj1->iDiff0  = Gia_ObjId(p, pObj1);
        pObj1->fCompl0 = 0;
    }
}